

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

void Frc_ManTransformRefs(Gia_Man_t *p,int *pnObjs,int *pnFanios)

{
  undefined1 *puVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *vVisit;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  
  if (p->pRefs == (int *)0x0) {
    __assert_fail("p->pRefs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                  ,0x16c,"void Frc_ManTransformRefs(Gia_Man_t *, int *, int *)");
  }
  Gia_ManCleanMark0(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x40000000;
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      iVar4 = pVVar7->pArray[lVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_006d8a6e;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar4].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      lVar5 = lVar5 + 1;
      pVVar7 = p->vCis;
    } while (lVar5 < pVVar7->nSize);
  }
  uVar10 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar5 = 0;
    lVar9 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar12 = (uint)*(ulong *)(&pGVar2->field_0x0 + lVar5);
      if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
        if ((int)uVar10 <= lVar9) goto LAB_006d8aac;
        *(ulong *)(&pGVar2->field_0x0 + lVar5) =
             *(ulong *)(&pGVar2->field_0x0 + lVar5) & 0xffffffff3fffffff |
             (ulong)((uint)(1 < p->pRefs[lVar9]) << 0x1e);
      }
      lVar9 = lVar9 + 1;
      uVar10 = (ulong)p->nObjs;
      lVar5 = lVar5 + 0xc;
    } while (lVar9 < (long)uVar10);
  }
  pVVar7 = p->vCos;
  iVar4 = pVVar7->nSize;
  if (0 < iVar4) {
    lVar5 = 0;
    do {
      iVar4 = pVVar7->pArray[lVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_006d8a6e;
      pGVar2 = p->pObjs + iVar4;
      *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) =
           *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) | 0x40000000;
      lVar5 = lVar5 + 1;
      pVVar7 = p->vCos;
      iVar4 = pVVar7->nSize;
    } while (lVar5 < iVar4);
  }
  if ((long)p->nObjs < 1) {
LAB_006d8847:
    iVar8 = 0;
  }
  else {
    lVar5 = 0;
    iVar8 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_006d8847;
      iVar8 = iVar8 + (uint)((*(uint *)(&p->pObjs->field_0x0 + lVar5) >> 0x1e & 1) != 0);
      lVar5 = lVar5 + 0xc;
    } while ((long)p->nObjs * 0xc != lVar5);
  }
  *pnObjs = iVar8 + iVar4;
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  piVar6 = (int *)calloc((long)p->nObjs,4);
  p->pRefs = piVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  vVisit = (Vec_Int_t *)malloc(0x10);
  vVisit->nCap = 100;
  vVisit->nSize = 0;
  piVar6 = (int *)malloc(400);
  vVisit->pArray = piVar6;
  Gia_ManCleanMark1(p);
  if (p->nObjs < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    while (p->pObjs != (Gia_Obj_t *)0x0) {
      pGVar2 = p->pObjs + lVar5;
      uVar12 = *(uint *)pGVar2;
      if ((uVar12 & 0xc0000000) == 0x40000000 && (~uVar12 & 0x1fffffff) != 0) {
        Frc_ManCollectSuper(p,pGVar2,pVVar7,vVisit);
        uVar12 = pVVar7->nSize;
        uVar10 = (ulong)uVar12;
        if (0 < (int)uVar12) {
          piVar6 = pVVar7->pArray;
          lVar9 = 0;
          do {
            uVar12 = (uint)uVar10;
            lVar11 = (long)piVar6[lVar9];
            if ((lVar11 < 0) || (p->nObjs <= piVar6[lVar9])) goto LAB_006d8a6e;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            if ((p->pObjs[lVar11].field_0x3 & 0x40) == 0) {
              __assert_fail("pFanin->fMark0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                            ,400,"void Frc_ManTransformRefs(Gia_Man_t *, int *, int *)");
            }
            p->pRefs[lVar11] = p->pRefs[lVar11] + 1;
            lVar9 = lVar9 + 1;
            uVar12 = pVVar7->nSize;
            uVar10 = (ulong)(int)uVar12;
          } while (lVar9 < (long)uVar10);
        }
        iVar4 = uVar12 + iVar4;
      }
      lVar5 = lVar5 + 1;
      if (p->nObjs <= lVar5) break;
    }
  }
  Gia_ManCheckMark1(p);
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  if (vVisit->pArray != (int *)0x0) {
    free(vVisit->pArray);
    vVisit->pArray = (int *)0x0;
  }
  free(vVisit);
  pVVar7 = p->vCos;
  iVar8 = pVVar7->nSize;
  if (0 < iVar8) {
    piVar6 = pVVar7->pArray;
    lVar5 = 0;
    do {
      iVar8 = piVar6[lVar5];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_006d8a6e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      pGVar2 = pGVar3 + iVar8;
      uVar10 = (ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff);
      if ((pGVar2[-uVar10].field_0x3 & 0x40) == 0) {
        __assert_fail("pObj->fMark0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                      ,0x19b,"void Frc_ManTransformRefs(Gia_Man_t *, int *, int *)");
      }
      pGVar2 = pGVar2 + -uVar10;
      if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) {
LAB_006d8aac:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      p->pRefs[(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555] =
           p->pRefs[(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555] + 1;
      lVar5 = lVar5 + 1;
      iVar8 = pVVar7->nSize;
    } while (lVar5 < iVar8);
  }
  *pnFanios = iVar8 + iVar4;
  return;
}

Assistant:

void Frc_ManTransformRefs( Gia_Man_t * p, int * pnObjs, int * pnFanios )  
{
    Vec_Int_t * vSuper, * vVisit;
    Gia_Obj_t * pObj, * pFanin;
    int i, k, Counter;
    assert( p->pRefs != NULL );

    // mark nodes to be used in the logic network
    Gia_ManCleanMark0( p );
    Gia_ManConst0(p)->fMark0 = 1;
    // mark the inputs
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 1;
    // mark those nodes that have ref count more than 1
    Gia_ManForEachAnd( p, pObj, i )
        pObj->fMark0 = (Gia_ObjRefNum(p, pObj) > 1);
    // mark the output drivers
    Gia_ManForEachCoDriver( p, pObj, i )
        pObj->fMark0 = 1;

    // count the number of nodes
    Counter = 0;
    Gia_ManForEachObj( p, pObj, i )
        Counter += pObj->fMark0;
    *pnObjs = Counter + Gia_ManCoNum(p);

    // reset the references
    ABC_FREE( p->pRefs );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    // reference from internal nodes
    Counter = 0;
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManCleanMark1( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
            continue;
        Frc_ManCollectSuper( p, pObj, vSuper, vVisit );
        Gia_ManForEachObjVec( vSuper, p, pFanin, k )
        {
            assert( pFanin->fMark0 );
            Gia_ObjRefInc( p, pFanin );
        }
        Counter += Vec_IntSize( vSuper );
    }
    Gia_ManCheckMark1( p );
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // reference from outputs
    Gia_ManForEachCoDriver( p, pObj, i )
    {
        assert( pObj->fMark0 );
        Gia_ObjRefInc( p, pObj );
    }
    *pnFanios = Counter + Gia_ManCoNum(p);
}